

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this,TPZCompMesh *cmesh)

{
  TPZCompMesh *in_RSI;
  TPZSavable *in_RDI;
  TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  *unaff_retaddr;
  TPZSavable *vtt;
  
  vtt = in_RDI;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_025787b8);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 0x2c),&PTR_construction_vtable_136__025787a8);
  TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
  TPZStructMatrix(unaff_retaddr,&vtt->_vptr_TPZSavable,in_RSI);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<std::complex<double>,TPZStructMatrixOT<std::complex<double>>>::
        vtable + 0x68);
  in_RDI[0x2c]._vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<std::complex<double>,TPZStructMatrixOT<std::complex<double>>>::
        vtable + 0x238);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<std::complex<double>,TPZStructMatrixOT<std::complex<double>>>::
        vtable + 0x68);
  in_RDI[0x14]._vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<std::complex<double>,TPZStructMatrixOT<std::complex<double>>>::
        vtable + 0x130);
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}